

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

char * kern::level_to_str(LogLevel *level)

{
  LogLevel *level_local;
  char *local_8;
  
  switch(*level) {
  case Trace:
    local_8 = "trace";
    break;
  case Debug:
    local_8 = "debug";
    break;
  default:
    local_8 = "N/A";
    break;
  case Info:
    local_8 = "info";
    break;
  case Warning:
    local_8 = "warning";
    break;
  case Error:
    local_8 = "error";
    break;
  case Fatal:
    local_8 = "fatal";
  }
  return local_8;
}

Assistant:

const char *level_to_str(const LogLevel &level) noexcept {
        switch(level) {
            case LogLevel::Trace:
                return "trace";
            case LogLevel::Debug:
                return "debug";
            case LogLevel::Info:
                return "info";
            case LogLevel::Warning:
                return "warning";
            case LogLevel::Error:
                return "error";
            case LogLevel::Fatal:
                return "fatal";
            default:
                return "N/A";
        }
    }